

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-quants.c
# Opt level: O2

void dequantize_row_iq4_xs(block_iq4_xs *x,float *y,int64_t k)

{
  block_iq4_xs *pbVar1;
  float fVar2;
  char cVar3;
  ushort uVar4;
  long lVar5;
  int j;
  long lVar6;
  long lVar7;
  uint8_t *puVar8;
  int ib;
  ulong uVar9;
  float fVar10;
  
  lVar7 = 0;
  lVar5 = k / 0x100;
  if (k / 0x100 < 1) {
    lVar5 = lVar7;
  }
  for (; lVar7 != lVar5; lVar7 = lVar7 + 1) {
    pbVar1 = x + lVar7;
    puVar8 = pbVar1->qs;
    fVar2 = ggml_table_f32_f16[pbVar1->d];
    uVar4 = pbVar1->scales_h;
    for (uVar9 = 0; (int)uVar9 != 8; uVar9 = (ulong)((int)uVar9 + 1)) {
      fVar10 = (float)(int)((uVar4 >> ((char)uVar9 * '\x02' & 0x1fU) & 3) * 0x10 +
                            (x[lVar7].scales_l[uVar9 >> 1] >> ((char)uVar9 * '\x04' & 4U) & 0xf) +
                           -0x20) * fVar2;
      for (lVar6 = 0; lVar6 != 0x10; lVar6 = lVar6 + 1) {
        cVar3 = kvalues_iq4nl[puVar8[lVar6] >> 4];
        y[lVar6] = (float)(int)kvalues_iq4nl[puVar8[lVar6] & 0xf] * fVar10;
        y[lVar6 + 0x10] = (float)(int)cVar3 * fVar10;
      }
      y = y + 0x20;
      puVar8 = puVar8 + 0x10;
    }
  }
  return;
}

Assistant:

void dequantize_row_iq4_xs(const block_iq4_xs * GGML_RESTRICT x, float * GGML_RESTRICT y, int64_t k) {
    assert(k % QK_K == 0);
    const int64_t nb = k / QK_K;

    for (int i = 0; i < nb; i++) {

        const uint8_t * qs = x[i].qs;

        const float d = GGML_FP16_TO_FP32(x[i].d);

        for (int ib = 0; ib < QK_K/32; ++ib) {
            const int ls = ((x[i].scales_l[ib/2] >> 4*(ib%2)) & 0xf) | (((x[i].scales_h >> 2*ib) & 3) << 4);
            const float dl = d * (ls - 32);
            for (int j = 0; j < 16; ++j) {
                y[j+ 0] = dl * kvalues_iq4nl[qs[j] & 0xf];
                y[j+16] = dl * kvalues_iq4nl[qs[j] >>  4];
            }
            y  += 32;
            qs += 16;
        }
    }
}